

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

Validity * __thiscall
capnp::compiler::CompilerMain::addSourcePrefix
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr prefix)

{
  StringPtr pathStr;
  GlobalErrorReporter local_28;
  ProcessContext *local_20;
  ArrayDisposer *local_18;
  
  pathStr.content.size_ = prefix.content.ptr;
  pathStr.content.ptr = (char *)this;
  getSourceDirectory((CompilerMain *)&stack0xffffffffffffffd8,pathStr,prefix.content.size_._0_1_);
  if (local_28._vptr_GlobalErrorReporter == (_func_int **)0x0) {
    kj::heapString((String *)&stack0xffffffffffffffd8,"no such directory",0x11);
    (__return_storage_ptr__->errorMessage).ptr.isSet = true;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
         (char *)local_28._vptr_GlobalErrorReporter;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ = (size_t)local_20;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer = local_18;
  }
  else {
    (__return_storage_ptr__->errorMessage).ptr.isSet = false;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity addSourcePrefix(kj::StringPtr prefix) {
    if (getSourceDirectory(prefix, true) == kj::none) {
      return "no such directory";
    } else {
      return true;
    }
  }